

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qjsoncbor.cpp
# Opt level: O3

QCborArray __thiscall QCborArray::fromStringList(QCborArray *this,QStringList *list)

{
  long lVar1;
  QString *pQVar2;
  long lVar3;
  QStringView s;
  
  (this->d).d.ptr = (QCborContainerPrivate *)&DAT_aaaaaaaaaaaaaaaa;
  QCborArray(this);
  detach(this,(list->d).size);
  lVar1 = (list->d).size;
  if (lVar1 != 0) {
    pQVar2 = (list->d).ptr;
    lVar3 = 0;
    do {
      s.m_data = *(storage_type_conflict **)((long)&(pQVar2->d).ptr + lVar3);
      s.m_size = *(qsizetype *)((long)&(pQVar2->d).size + lVar3);
      QCborContainerPrivate::append((this->d).d.ptr,s);
      lVar3 = lVar3 + 0x18;
    } while (lVar1 * 0x18 != lVar3);
  }
  return (QExplicitlySharedDataPointer<QCborContainerPrivate>)
         (QExplicitlySharedDataPointer<QCborContainerPrivate>)this;
}

Assistant:

QCborArray QCborArray::fromStringList(const QStringList &list)
{
    QCborArray a;
    a.detach(list.size());
    for (const QString &s : list)
        a.d->append(s);
    return a;
}